

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O0

void __thiscall
Js::StringProfiler::PrintOne(StringProfiler *this,uint len,StringMetrics metrics,uint totalCount)

{
  uint uVar1;
  uint uVar2;
  uint in_register_00000034;
  uint totalCount_local;
  uint len_local;
  undefined1 local_18 [8];
  StringMetrics metrics_local;
  
  local_18._4_4_ = in_register_00000034;
  local_18._0_4_ = len;
  metrics_local.count7BitASCII = metrics.count7BitASCII;
  uVar1 = StringMetrics::Total((StringMetrics *)local_18);
  uVar2 = StringMetrics::Total((StringMetrics *)local_18);
  Output::Print(L"%10u %10u %10u %10u %10u (%.1f%%)\n",
                ((double)uVar2 * 100.0) / (double)metrics.countUnicode,(ulong)this & 0xffffffff,
                (ulong)len,(ulong)in_register_00000034,(ulong)metrics.count7BitASCII,(ulong)uVar1);
  return;
}

Assistant:

void StringProfiler::PrintOne(
        unsigned int len,
        StringMetrics metrics,
        uint totalCount
        )
    {
        Output::Print(_u("%10u %10u %10u %10u %10u (%.1f%%)\n"),
                len,
                metrics.count7BitASCII,
                metrics.count8BitASCII,
                metrics.countUnicode,
                metrics.Total(),
                100.0*(double)metrics.Total()/(double)totalCount
                );
    }